

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  int local_f4;
  sysbvm_contextCreationOptions_t local_e8;
  
  uVar3 = 0;
  memset(&local_e8,0,0xb8);
  if (argc < 3) {
    if (argc == 2) goto LAB_00102b9e;
  }
  else {
    iVar2 = strcmp(argv[1],"-load-image");
    if (iVar2 == 0) {
      context = sysbvm_context_loadImageFromFileNamed(argv[2]);
      iVar2 = 3;
      goto LAB_00102ca7;
    }
LAB_00102b9e:
    uVar4 = 1;
    local_f4 = 0;
    uVar3 = 0;
    _Var1 = false;
    do {
      __s1 = argv[uVar4];
      iVar2 = strcmp(__s1,"-m32");
      local_e8.nojit = _Var1;
      if (iVar2 == 0) {
        uVar3 = 4;
      }
      else {
        iVar2 = strcmp(__s1,"-m64");
        if (iVar2 == 0) {
          uVar3 = 8;
        }
        else {
          iVar2 = strcmp(__s1,"-nojit");
          if (iVar2 == 0) {
            local_e8.nojit = true;
          }
          else {
            iVar2 = strcmp(__s1,"-nogc");
            if (iVar2 == 0) {
              local_f4 = 3;
            }
            else {
              iVar2 = strcmp(__s1,"-moving-gc");
              if (iVar2 == 0) {
                local_f4 = 1;
              }
              else {
                iVar2 = strcmp(__s1,"-non-moving-gc");
                if (iVar2 == 0) {
                  local_f4 = 2;
                }
              }
            }
          }
        }
      }
      uVar4 = uVar4 + 1;
      _Var1 = local_e8.nojit;
    } while ((uint)argc != uVar4);
    local_e8.gcType = local_f4;
  }
  local_e8.targetWordSize = uVar3;
  context = sysbvm_context_createWithOptions(&local_e8);
  iVar2 = 1;
LAB_00102ca7:
  if (context == (sysbvm_context_t *)0x0) {
    main_cold_1();
    iVar2 = 1;
  }
  else {
    iVar2 = mainWithContext(iVar2,argc,argv);
    if (destinationImageFilename != (char *)0x0) {
      sysbvm_context_saveImageToFileNamed(context,destinationImageFilename);
    }
    sysbvm_context_destroy(context);
  }
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[])
{
    sysbvm_contextCreationOptions_t contextOptions = {0};

    // Allow creating the context by loading it from an image.
    int startArgumentIndex = 1;
    if(argc >= 3 && !strcmp(argv[1], "-load-image"))
    {
        context = sysbvm_context_loadImageFromFileNamed(argv[2]);
        startArgumentIndex = 3;
    }
    else
    {
        for(int i = 1; i < argc; ++i)
        {
            if(!strcmp(argv[i], "-m32"))
                contextOptions.targetWordSize = 4;
            else if(!strcmp(argv[i], "-m64"))
                contextOptions.targetWordSize = 8;
            else if(!strcmp(argv[i], "-nojit"))
                contextOptions.nojit = true;
            else if(!strcmp(argv[i], "-nogc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_DISABLED;
            else if(!strcmp(argv[i], "-moving-gc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_MOVING;
            else if(!strcmp(argv[i], "-non-moving-gc"))
                contextOptions.gcType = SYSBVM_GC_TYPE_NON_MOVING;
        }

        context = sysbvm_context_createWithOptions(&contextOptions);
    }

    if(!context)
    {
        fprintf(stderr, "Failed to create sysbvm context.\n");
        return 1;
    }

    int exitCode = mainWithContext(startArgumentIndex, argc, argv);

    // Allow saving the context as an image.
    if(destinationImageFilename)
        sysbvm_context_saveImageToFileNamed(context, destinationImageFilename);
    sysbvm_context_destroy(context);
    
    return exitCode;
}